

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node,uchar **dst,
                   size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  byte bVar1;
  ushort uVar2;
  vector_brodnik<unsigned_char_*> *this;
  size_t sVar3;
  size_t sVar4;
  pointer pppuVar5;
  uchar **__src;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node_00;
  _func_void_uchar_ptr_ptr_int_int *p_Var6;
  size_t __n;
  uchar **__dest;
  pointer ppvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  _func_void_uchar_ptr_ptr_int_int *p_Var12;
  _func_void_uchar_ptr_ptr_int_int *local_60;
  
  ppvVar7 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar7) {
    uVar8 = 0;
    do {
      if (((ulong)ppvVar7[uVar8] & 1) == 0) {
        this = (vector_brodnik<unsigned_char_*> *)ppvVar7[uVar8];
        if (this != (vector_brodnik<unsigned_char_*> *)0x0) {
          bVar1 = this->_superblock;
          small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                       CONCAT71((int7)((ulong)small_sort >> 8),bVar1);
          uVar2 = this->_left_in_superblock;
          sVar3 = this->_block_size;
          sVar4 = this->_left_in_block;
          __dest = dst;
          if ((this->_index_block).
              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this->_index_block).
              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar11 = 8;
            p_Var6 = (_func_void_uchar_ptr_ptr_int_int *)0x0;
            lVar9 = 8;
            local_60 = (_func_void_uchar_ptr_ptr_int_int *)0x0;
            do {
              if (lVar9 != 0) {
                lVar10 = lVar9;
                p_Var12 = p_Var6;
                do {
                  pppuVar5 = (this->_index_block).
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                               (((long)(this->_index_block).
                                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pppuVar5
                                >> 3) - 1);
                  if (p_Var12 == small_sort) goto LAB_0020e666;
                  if (lVar11 != 0) {
                    memmove(__dest,pppuVar5[(long)p_Var12],lVar11 * 8);
                  }
                  p_Var12 = p_Var12 + 1;
                  __dest = __dest + lVar11;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
              p_Var6 = p_Var6 + lVar9;
              lVar9 = lVar9 << (sbyte)local_60;
              small_sort = (_func_void_uchar_ptr_ptr_int_int *)((ulong)local_60 ^ 1);
              lVar11 = lVar11 << (sbyte)small_sort;
              local_60 = small_sort;
            } while (p_Var6 < (_func_void_uchar_ptr_ptr_int_int *)
                              ((long)(this->_index_block).
                                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_index_block).
                                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
LAB_0020e666:
          __src = (this->_index_block).
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          __n = (long)this->_insertpos - (long)__src;
          if (__n != 0) {
            memmove(__dest,__src,__n);
          }
          lVar9 = ((long)(2 << (bVar1 & 0x1f)) - (uVar2 * sVar3 + sVar4)) + -0x40;
          if ((char)uVar8 != '\0') {
            mkqsort(dst,(int)lVar9,(int)depth);
          }
          dst = dst + lVar9;
          vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
          operator_delete(this);
        }
      }
      else {
        node_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node
                            (node,(uint)uVar8);
        dst = traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                        (node_00,dst,depth + 1,small_sort);
      }
      uVar8 = (ulong)((uint)uVar8 + 1);
      ppvVar7 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(node->_buckets).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppvVar7 >> 3));
  }
  if (ppvVar7 != (pointer)0x0) {
    operator_delete(ppvVar7);
  }
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}